

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_pageview.cpp
# Opt level: O0

void QtMWidgets::PageView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  QMetaType QVar5;
  void *_v_1;
  PageView *_t_2;
  void *_v;
  PageView *_t_1;
  int *result;
  QMetaType local_38;
  QMetaType local_30;
  QObject *local_28;
  PageView *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  _t = (PageView *)_a;
  _a_local._0_4_ = _id;
  _a_local._4_4_ = _c;
  __id_local = _o;
  if (_c == InvokeMetaMethod) {
    local_28 = _o;
    switch(_id) {
    case 0:
      currentChanged((PageView *)_o,*_a[1]);
      break;
    case 1:
      widgetRemoved((PageView *)_o,*_a[1]);
      break;
    case 2:
      setCurrentIndex((PageView *)_o,*_a[1]);
      break;
    case 3:
      setCurrentWidget((PageView *)_o,*_a[1]);
      break;
    case 4:
      _q_currentIndexChanged((PageView *)_o,*_a[1],*_a[2]);
      break;
    case 5:
      _q_normalizePageAnimation((PageView *)_o,(QVariant *)_a[1]);
      break;
    case 6:
      _q_normalizeAnimationFinished((PageView *)_o);
    }
  }
  else if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 3) {
      if (*_a[1] == 0) {
        QVar5 = QMetaType::fromType<QWidget*>();
        **(undefined8 **)_t = QVar5.d_ptr;
      }
      else {
        memset(&local_38,0,8);
        QMetaType::QMetaType(&local_38);
        **(undefined8 **)_t = local_38.d_ptr;
      }
    }
    else {
      memset(&local_30,0,8);
      QMetaType::QMetaType(&local_30);
      **(undefined8 **)_t = local_30.d_ptr;
    }
  }
  else if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    if (pcVar1 == currentChanged && (pcVar1 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
    else {
      pcVar1 = *_a[1];
      if (pcVar1 == widgetRemoved && (pcVar1 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
        *(undefined4 *)*_a = 1;
      }
    }
  }
  else if (_c == ReadProperty) {
    piVar2 = (int *)*_a;
    if (_id == 0) {
      iVar4 = currentIndex((PageView *)_o);
      *piVar2 = iVar4;
    }
    else if (_id == 1) {
      iVar4 = count((PageView *)_o);
      *piVar2 = iVar4;
    }
    else if (_id == 2) {
      bVar3 = showPageControl((PageView *)_o);
      *(bool *)piVar2 = bVar3;
    }
  }
  else if (_c == WriteProperty) {
    if (_id == 0) {
      setCurrentIndex((PageView *)_o,**_a);
    }
    else if (_id == 2) {
      setShowPageControl((PageView *)_o,(bool)(**_a & 1));
    }
  }
  return;
}

Assistant:

void QtMWidgets::PageView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<PageView *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->widgetRemoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->setCurrentWidget((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 4: _t->_q_currentIndexChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 5: _t->_q_normalizePageAnimation((*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[1]))); break;
        case 6: _t->_q_normalizeAnimationFinished(); break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (PageView::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PageView::currentChanged)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (PageView::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PageView::widgetRemoved)) {
                *result = 1;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<PageView *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< int*>(_v) = _t->currentIndex(); break;
        case 1: *reinterpret_cast< int*>(_v) = _t->count(); break;
        case 2: *reinterpret_cast< bool*>(_v) = _t->showPageControl(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<PageView *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setCurrentIndex(*reinterpret_cast< int*>(_v)); break;
        case 2: _t->setShowPageControl(*reinterpret_cast< bool*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}